

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O0

void mbedtls_mpi_core_shift_l(mbedtls_mpi_uint *X,size_t limbs,size_t count)

{
  sbyte sVar1;
  ulong uVar2;
  mbedtls_mpi_uint r1;
  mbedtls_mpi_uint r0;
  size_t v1;
  size_t v0;
  size_t i;
  size_t count_local;
  size_t limbs_local;
  mbedtls_mpi_uint *X_local;
  
  r0 = 0;
  uVar2 = count >> 6;
  i = limbs;
  if (uVar2 != 0) {
    for (; uVar2 < i; i = i - 1) {
      X[i - 1] = X[(i - uVar2) + -1];
    }
    for (; i != 0; i = i - 1) {
      X[i - 1] = 0;
    }
  }
  i = uVar2;
  if ((count & 0x3f) != 0) {
    for (; i < limbs; i = i + 1) {
      uVar2 = X[i];
      sVar1 = (sbyte)(count & 0x3f);
      X[i] = X[i] << sVar1;
      X[i] = r0 | X[i];
      r0 = uVar2 >> (0x40U - sVar1 & 0x3f);
    }
  }
  return;
}

Assistant:

void mbedtls_mpi_core_shift_l(mbedtls_mpi_uint *X, size_t limbs,
                              size_t count)
{
    size_t i, v0, v1;
    mbedtls_mpi_uint r0 = 0, r1;

    v0 = count / (biL);
    v1 = count & (biL - 1);

    /*
     * shift by count / limb_size
     */
    if (v0 > 0) {
        for (i = limbs; i > v0; i--) {
            X[i - 1] = X[i - v0 - 1];
        }

        for (; i > 0; i--) {
            X[i - 1] = 0;
        }
    }

    /*
     * shift by count % limb_size
     */
    if (v1 > 0) {
        for (i = v0; i < limbs; i++) {
            r1 = X[i] >> (biL - v1);
            X[i] <<= v1;
            X[i] |= r0;
            r0 = r1;
        }
    }
}